

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::visitGlobalGet
          (Flow *__return_storage_ptr__,ConstantExpressionRunner<wasm::CExpressionRunner> *this,
          GlobalGet *curr)

{
  Module *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  Global *pGVar3;
  iterator iVar4;
  
  this_00 = (this->super_ExpressionRunner<wasm::CExpressionRunner>).module;
  if (((this_00 != (Module *)0x0) &&
      (pGVar3 = Module::getGlobal(this_00,(Name)(curr->name).super_IString.str),
      (pGVar3->super_Importable).module.super_IString.str._M_str == (char *)0x0)) &&
     (pGVar3->mutable_ == false)) {
    ExpressionRunner<wasm::CExpressionRunner>::visit
              (__return_storage_ptr__,&this->super_ExpressionRunner<wasm::CExpressionRunner>,
               pGVar3->init);
    return __return_storage_ptr__;
  }
  iVar4 = std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->globalValues)._M_h,&curr->name);
  uVar2 = NONCONSTANT_FLOW._8_8_;
  uVar1 = NONCONSTANT_FLOW._0_8_;
  if (iVar4.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Literals>,_true>._M_cur ==
      (__node_type *)0x0) {
    *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                      _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = uVar1;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)uVar2;
  }
  else {
    Flow::Flow(__return_storage_ptr__,
               (Literals *)
               ((long)iVar4.
                      super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Literals>,_true>.
                      _M_cur + 0x18));
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitGlobalGet(GlobalGet* curr) {
    NOTE_ENTER("GlobalGet");
    NOTE_NAME(curr->name);
    if (this->module != nullptr) {
      auto* global = this->module->getGlobal(curr->name);
      // Check if the global has an immutable value anyway
      if (!global->imported() && !global->mutable_) {
        return ExpressionRunner<SubType>::visit(global->init);
      }
    }
    // Check if a constant value has been set in the context of this runner.
    auto iter = globalValues.find(curr->name);
    if (iter != globalValues.end()) {
      return Flow(iter->second);
    }
    return Flow(NONCONSTANT_FLOW);
  }